

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CIrrDeviceSDL.cpp
# Opt level: O0

void __thiscall irr::CIrrDeviceSDL::createDriver(CIrrDeviceSDL *this)

{
  dimension2d<unsigned_int> dVar1;
  SIrrlichtCreationParameters *params;
  IFileSystem *io;
  SIrrlichtCreationParameters *in_RDI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double __x;
  IFileSystem *unaff_retaddr;
  CIrrDeviceSDL *in_stack_ffffffffffffffd8;
  
  if (in_RDI[1].WindowSize.Height == 0) {
    dVar1 = (dimension2d<unsigned_int>)
            video::createNullDriver(unaff_retaddr,(dimension2d<unsigned_int> *)in_RDI);
    in_RDI->WindowSize = dVar1;
  }
  else {
    params = (SIrrlichtCreationParameters *)operator_new(0x48);
    video::CSDLManager::CSDLManager((CSDLManager *)params,in_stack_ffffffffffffffd8);
    *(SIrrlichtCreationParameters **)(in_RDI + 1) = params;
    io = (IFileSystem *)(ulong)(in_RDI[1].WindowSize.Height - 1);
    switch(io) {
    case (IFileSystem *)0x0:
      dVar1 = (dimension2d<unsigned_int>)
              video::createOpenGLDriver(in_RDI,io,(IContextManager *)params);
      in_RDI->WindowSize = dVar1;
      __x = extraout_XMM0_Qa_00;
      break;
    default:
      __x = extraout_XMM0_Qa;
      break;
    case (IFileSystem *)0x2:
      dVar1 = (dimension2d<unsigned_int>)
              video::createOGLES2Driver
                        (params,(IFileSystem *)in_stack_ffffffffffffffd8,(IContextManager *)0x38efbb
                        );
      in_RDI->WindowSize = dVar1;
      __x = extraout_XMM0_Qa_02;
      break;
    case (IFileSystem *)0x3:
      dVar1 = (dimension2d<unsigned_int>)
              video::createWebGL1Driver
                        (params,(IFileSystem *)in_stack_ffffffffffffffd8,(IContextManager *)0x38efe2
                        );
      in_RDI->WindowSize = dVar1;
      __x = extraout_XMM0_Qa_03;
      break;
    case (IFileSystem *)0x4:
      dVar1 = (dimension2d<unsigned_int>)
              video::createOpenGL3Driver(in_RDI,io,(IContextManager *)params);
      in_RDI->WindowSize = dVar1;
      __x = extraout_XMM0_Qa_01;
    }
    if (in_RDI->WindowSize == (dimension2d<unsigned_int>)0x0) {
      os::Printer::log((Printer *)"Could not create video driver",__x);
    }
  }
  return;
}

Assistant:

void CIrrDeviceSDL::createDriver()
{
	if (CreationParams.DriverType == video::EDT_NULL) {
		VideoDriver = video::createNullDriver(FileSystem, CreationParams.WindowSize);
		return;
	}

	ContextManager = new video::CSDLManager(this);
	switch (CreationParams.DriverType) {
	case video::EDT_OPENGL:
		VideoDriver = video::createOpenGLDriver(CreationParams, FileSystem, ContextManager);
		break;
	case video::EDT_OPENGL3:
		VideoDriver = video::createOpenGL3Driver(CreationParams, FileSystem, ContextManager);
		break;
	case video::EDT_OGLES2:
		VideoDriver = video::createOGLES2Driver(CreationParams, FileSystem, ContextManager);
		break;
	case video::EDT_WEBGL1:
		VideoDriver = video::createWebGL1Driver(CreationParams, FileSystem, ContextManager);
		break;
	default:;
	}
	if (!VideoDriver)
		os::Printer::log("Could not create video driver", ELL_ERROR);
}